

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::btToLevel(SAT *this,int level)

{
  lbool lVar1;
  uint nelems;
  vec<Lit> *pvVar2;
  long lVar3;
  ulong uVar4;
  uint n;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = (this->trail).sz;
  uVar6 = (ulong)uVar5;
  if (level < (int)(uVar5 - 1)) {
    nelems = level + 1;
    if ((int)nelems < (int)uVar5) {
      do {
        uVar5 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar5;
        pvVar2 = (this->trail).data;
        lVar3 = (long)(int)pvVar2[uVar6].sz;
        pvVar2 = pvVar2 + uVar6;
        if (0 < lVar3) {
          uVar4 = lVar3 + 1;
          lVar1.value = ::l_Undef.value;
          do {
            n = pvVar2->data[uVar4 - 2].x >> 1;
            (this->assigns).data[n] = lVar1.value;
            if ((((int)(this->order_heap).indices.sz <= (int)n) ||
                ((this->order_heap).indices.data[n] < 0)) &&
               (((uint)(this->flags).data[n] & 1) != 0)) {
              Heap<SAT::VarOrderLt>::insert(&this->order_heap,n);
              lVar1 = ::l_Undef;
            }
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
        }
        pvVar2->sz = 0;
        for (uVar4 = (ulong)(this->rtrail).data[uVar6].sz; uVar4 != 0; uVar4 = uVar4 - 1) {
          free((this->rtrail).data[uVar6].data[uVar4 - 1]);
        }
      } while ((int)nelems < (int)uVar5);
    }
    vec<vec<Lit>_>::resize(&this->trail,nelems);
    (this->qhead).sz = nelems;
    vec<vec<Clause_*>_>::resize(&this->rtrail,nelems);
    Engine::btToLevel(&engine,level);
    if (so.mip != false) {
      MIP::btToLevel(mip,level);
      return;
    }
  }
  return;
}

Assistant:

void SAT::btToLevel(int level) {
#if DEBUG_VERBOSE
	std::cerr << "SAT::btToLevel( " << level << ")\n";
#endif
	if (decisionLevel() <= level) {
		return;
	}

	for (int l = trail.size(); l-- > level + 1;) {
		untrailToPos(trail[l], 0);
		for (int i = rtrail[l].size(); (i--) != 0;) {
			free(rtrail[l][i]);
		}
	}
	trail.resize(level + 1);
	qhead.resize(level + 1);
	rtrail.resize(level + 1);

	engine.btToLevel(level);
	if (so.mip) {
		mip->btToLevel(level);
	}
}